

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool __thiscall cs::codecvt::utf8::is_identifier(utf8 *this,char32_t ch)

{
  bool bVar1;
  int iVar2;
  uint in_ESI;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_1;
  
  bVar1 = compiler_type::issignal(L'\0');
  if (bVar1) {
    local_1 = false;
  }
  else if (in_ESI < 0x80) {
    local_16 = true;
    if (in_ESI != 0x5f) {
      iVar2 = iswalnum(in_ESI);
      local_16 = iVar2 != 0;
    }
    local_1 = local_16;
  }
  else {
    if (((in_ESI < 0x4e00) || (local_15 = true, 0x9fa5 < in_ESI)) &&
       ((in_ESI < 0x9fa6 || (local_15 = true, 0x9fef < in_ESI)))) {
      local_15 = in_ESI == 0x3007;
    }
    local_1 = local_15;
  }
  return local_1;
}

Assistant:

bool is_identifier(char32_t ch) override
			{
				if (compiler_type::issignal(ch))
					return false;
				/**
				 * Chinese Character in Unicode Charset
				 * Basic:    0x4E00 - 0x9FA5
				 * Extended: 0x9FA6 - 0x9FEF
				 * Special:  0x3007
				 */
				if (ch > ascii_max)
					return (ch >= 0x4E00 && ch <= 0x9FA5) || (ch >= 0x9FA6 && ch <= 0x9FEF) || ch == 0x3007;
				else
					return ch == '_' || std::iswalnum(ch);
			}